

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamclient.h
# Opt level: O0

void __thiscall
hedg::Stream_Client::
send<boost::asio::basic_streambuf<std::allocator<char>>&,hedg::params::stream_order>
          (Stream_Client *this,code *f)

{
  _func_void_basic_streambuf<std::allocator<char>_>_ptr_stream_order *f_local;
  Stream_Client *this_local;
  
  (*f)(&(this->super_Client<hedg::Stream_Client>).inp_buff_);
  boost::asio::
  write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>>
            (&(this->super_Client<hedg::Stream_Client>).sock_,
             &(this->super_Client<hedg::Stream_Client>).inp_buff_);
  return;
}

Assistant:

void send(void(*f)(Buff, T), T p) {
		f(inp_buff_, p);
		boost::asio::write(sock_, inp_buff_);
	}